

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

int gost_mac(gost_ctx *ctx,int mac_len,uchar *data,uint data_len,uchar *mac)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  ulong __n;
  byte buffer [8];
  byte buf2 [8];
  byte local_48 [8];
  uchar *local_40;
  byte local_38 [8];
  
  local_40 = mac;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  if (data_len < 8) {
    uVar4 = 8;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      mac_block(ctx,local_48,data + uVar4);
      uVar2 = uVar4 + 8;
    } while (uVar4 + 0x10 <= data_len);
    uVar4 = uVar4 + 0x10;
  }
  if (uVar2 <= data_len && data_len - uVar2 != 0) {
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    memcpy(local_38,data + uVar2,(ulong)(data_len - uVar2));
    mac_block(ctx,local_48,local_38);
    uVar2 = uVar4;
  }
  if (uVar2 == 8) {
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    mac_block(ctx,local_48,local_38);
  }
  puVar1 = local_40;
  if (mac_len >> 3 < 1) {
    __n = 0;
  }
  else {
    __n = (ulong)(uint)(mac_len >> 3);
    memcpy(local_40,local_48,__n);
  }
  if ((mac_len & 7U) != 0) {
    bVar3 = local_48[__n];
    if ((mac_len & 7U) != 1) {
      bVar3 = '\0';
    }
    puVar1[__n] = bVar3;
  }
  return 1;
}

Assistant:

int gost_mac(gost_ctx * ctx, int mac_len, const unsigned char *data,
             unsigned int data_len, unsigned char *mac)
{
    byte buffer[8] = { 0, 0, 0, 0, 0, 0, 0, 0 };
    byte buf2[8];
    unsigned int i;
    for (i = 0; i + 8 <= data_len; i += 8)
        mac_block(ctx, buffer, data + i);
    if (i < data_len) {
        memset(buf2, 0, 8);
        memcpy(buf2, data + i, data_len - i);
        mac_block(ctx, buffer, buf2);
        i += 8;
    }
    if (i == 8) {
        memset(buf2, 0, 8);
        mac_block(ctx, buffer, buf2);
    }
    get_mac(buffer, mac_len, mac);
    return 1;
}